

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O3

void __thiscall deci::stack_t::~stack_t(stack_t *this)

{
  pointer ppvVar1;
  value_t *pvVar2;
  uint uVar3;
  ulong uVar4;
  
  (*this->result->_vptr_value_t[3])();
  uVar4 = (ulong)((long)(this->storage).
                        super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->storage).
                       super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl
                       .super__Vector_impl_data._M_start) >> 3;
  if (0 < (int)uVar4) {
    do {
      pvVar2 = Pop(this);
      (*pvVar2->_vptr_value_t[3])(pvVar2);
      uVar3 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar3;
    } while (uVar3 != 0);
  }
  dictionary_t::~dictionary_t(&this->context);
  ppvVar1 = (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppvVar1 != (pointer)0x0) {
    operator_delete(ppvVar1);
    return;
  }
  return;
}

Assistant:

stack_t::~stack_t() {
    this->result->Delete();
    this->Drop(this->Depth());
  }